

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O3

int setup_container_add_offset_test(void **state_)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  rle16_t *prVar7;
  int iVar8;
  run_container_t *run;
  array_container_t *container;
  uint16_t *puVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int32_t iVar15;
  
  pvVar4 = *state_;
  lVar5 = *(long *)((long)pvVar4 + 8);
  lVar6 = *(long *)((long)pvVar4 + 0x10);
  cVar1 = *(char *)((long)pvVar4 + 0x1a);
  if (cVar1 == '\x03') {
    run = run_container_create();
    _assert_true((ulong)(run != (run_container_t *)0x0),"rc != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x3d);
    if (lVar6 != 0) {
      lVar12 = 0;
      do {
        run_container_add(run,*(uint16_t *)(lVar5 + lVar12 * 2));
        lVar12 = lVar12 + 1;
      } while (lVar6 != lVar12);
    }
  }
  else {
    if (cVar1 == '\x02') {
      container = array_container_create();
      _assert_true((ulong)(container != (array_container_t *)0x0),"ac != NULL",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x35);
      if (lVar6 != 0) {
        iVar15 = container->cardinality;
        lVar12 = 0;
        do {
          uVar2 = *(ushort *)(lVar5 + lVar12 * 2);
          if ((iVar15 == 0) ||
             ((puVar9 = container->array, iVar15 != 0x7fffffff &&
              (puVar9[(long)iVar15 + -1] < uVar2)))) {
            if (iVar15 == container->capacity) {
              array_container_grow(container,iVar15 + 1,true);
              iVar15 = container->cardinality;
            }
            container->cardinality = iVar15 + 1;
            container->array[iVar15] = uVar2;
            iVar8 = iVar15 + 1;
          }
          else {
            if (iVar15 < 1) {
              uVar14 = 0;
            }
            else {
              iVar8 = iVar15 + -1;
              uVar14 = 0;
              do {
                uVar11 = iVar8 + (int)uVar14;
                uVar10 = uVar11 >> 1;
                uVar3 = *(ushort *)((long)puVar9 + (ulong)(uVar11 & 0xfffffffe));
                if (uVar3 < uVar2) {
                  uVar14 = (ulong)(uVar10 + 1);
                }
                else {
                  iVar8 = iVar15;
                  if (uVar3 <= uVar2) goto LAB_00103751;
                  iVar8 = uVar10 - 1;
                }
              } while ((int)uVar14 <= iVar8);
              iVar8 = 0x7fffffff;
              if (iVar15 == 0x7fffffff) goto LAB_00103751;
            }
            if (iVar15 == container->capacity) {
              array_container_grow(container,iVar15 + 1,true);
              puVar9 = container->array;
            }
            memmove(puVar9 + uVar14 + 1,puVar9 + uVar14,(long)(iVar15 - (int)uVar14) * 2);
            container->array[uVar14] = uVar2;
            iVar8 = container->cardinality + 1;
            container->cardinality = iVar8;
          }
LAB_00103751:
          iVar15 = iVar8;
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar6);
      }
      *(array_container_t **)((long)pvVar4 + 0x20) = container;
      return 0;
    }
    if (cVar1 != '\x01') {
      _assert_true(0,"false",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x44);
      return 0;
    }
    run = (run_container_t *)bitset_container_create();
    _assert_true((ulong)(run != (run_container_t *)0x0),"bc != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x2d);
    if (lVar6 != 0) {
      prVar7 = run->runs;
      iVar8 = run->n_runs;
      lVar12 = 0;
      do {
        uVar2 = *(ushort *)(lVar5 + lVar12 * 2);
        uVar14 = *(ulong *)(prVar7 + (ulong)(uVar2 >> 6) * 2);
        uVar13 = uVar14 | 1L << ((ulong)uVar2 & 0x3f);
        iVar8 = iVar8 + (int)((uVar14 ^ uVar13) >> ((byte)uVar2 & 0x3f));
        *(ulong *)(prVar7 + (ulong)(uVar2 >> 6) * 2) = uVar13;
        lVar12 = lVar12 + 1;
      } while (lVar6 != lVar12);
      run->n_runs = iVar8;
    }
  }
  *(run_container_t **)((long)pvVar4 + 0x20) = run;
  return 0;
}

Assistant:

static int setup_container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    bitset_container_t *bc;
    array_container_t *ac;
    run_container_t *rc;

    switch (test.type) {
        case BITSET_CONTAINER_TYPE:
            bc = bitset_container_create();
            assert_true(bc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                bitset_container_add(bc, test.values[i]);
            }
            state->in = bc;
            break;
        case ARRAY_CONTAINER_TYPE:
            ac = array_container_create();
            assert_true(ac != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                array_container_add(ac, test.values[i]);
            }
            state->in = ac;
            break;
        case RUN_CONTAINER_TYPE:
            rc = run_container_create();
            assert_true(rc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                run_container_add(rc, test.values[i]);
            }
            state->in = rc;
            break;
        default:
            assert_true(false);  // To catch buggy tests.
    }

    return 0;
}